

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O2

string * __thiscall
cmOSXBundleGenerator::InitMacOSXContentDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmOSXBundleGenerator *this,char *pkgloc)

{
  string loc;
  allocator local_40 [32];
  
  cmGeneratorTarget::GetMacContentDirectory(__return_storage_ptr__,this->GT,&this->ConfigName,false)
  ;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  cmsys::SystemTools::MakeDirectory((__return_storage_ptr__->_M_dataplus)._M_p);
  std::__cxx11::string::string((string *)&loc,pkgloc,local_40);
  std::__cxx11::string::find((char)&loc,0x2f);
  std::__cxx11::string::substr((ulong)local_40,(ulong)&loc);
  std::__cxx11::string::operator=((string *)&loc,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this->MacContentFolders,&loc);
  std::__cxx11::string::~string((string *)&loc);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmOSXBundleGenerator::InitMacOSXContentDirectory(const char* pkgloc)
{
  // Construct the full path to the content subdirectory.

  std::string macdir =
    this->GT->GetMacContentDirectory(this->ConfigName,
                                         /*implib*/ false);
  macdir += "/";
  macdir += pkgloc;
  cmSystemTools::MakeDirectory(macdir.c_str());

  // Record use of this content location.  Only the first level
  // directory is needed.
  {
  std::string loc = pkgloc;
  loc = loc.substr(0, loc.find('/'));
  this->MacContentFolders->insert(loc);
  }

  return macdir;
}